

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

Sub * google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub
                (Sub *__return_storage_ptr__,Options *options,Printer *p)

{
  allocator<char> local_141;
  string local_140;
  anon_class_16_2_37da2c3b_for_cb local_120 [2];
  allocator<char> local_f9;
  string local_f8;
  Sub local_d8;
  Printer *local_20;
  Printer *p_local;
  Options *options_local;
  
  local_20 = p;
  p_local = (Printer *)options;
  options_local = (Options *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"getter",&local_f9);
  local_120[0].options = (Options *)p_local;
  local_120[0].p = local_20;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::GetEmitRepeatedFieldGetterSub(google::protobuf::compiler::cpp::Options_const&,google::protobuf::io::Printer*)::_lambda()_1_>
            (&local_d8,&local_f8,local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
  io::Printer::Sub::WithSuffix(__return_storage_ptr__,&local_d8,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  io::Printer::Sub::~Sub(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return __return_storage_ptr__;
}

Assistant:

inline auto GetEmitRepeatedFieldGetterSub(const Options& options,
                                          io::Printer* p) {
  return io::Printer::Sub{
      "getter",
      [&options, p] {
        switch (options.bounds_check_mode) {
          case BoundsCheckMode::kNoEnforcement:
            p->Emit(R"cc(_internal_$name_internal$().Get(index))cc");
            break;
          case BoundsCheckMode::kReturnDefaultValue:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrDefault(_internal_$name_internal$(), index)
            )cc");
            break;
          case BoundsCheckMode::kAbort:
            p->Emit(R"cc(
              $pbi$::CheckedGetOrAbort(_internal_$name_internal$(), index)
            )cc");
            break;
        }
      }}
      .WithSuffix("");
}